

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyConfig.cpp
# Opt level: O0

string * __thiscall
ProxyConfig::getString
          (string *__return_storage_ptr__,ProxyConfig *this,char *key,string *defaultValue)

{
  bool bVar1;
  Ch *__s;
  allocator<char> local_31;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *local_30;
  Value *out_value;
  string *defaultValue_local;
  char *key_local;
  ProxyConfig *this_local;
  
  out_value = (Value *)defaultValue;
  defaultValue_local = (string *)key;
  key_local = (char *)this;
  this_local = (ProxyConfig *)__return_storage_ptr__;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::HasMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)this,key);
  if (bVar1) {
    local_30 = rapidjson::
               GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               ::operator[]<char_const>
                         ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                           *)this,(char *)defaultValue_local);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsString(local_30);
    if (bVar1) {
      __s = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetString(local_30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,&local_31);
      std::allocator<char>::~allocator(&local_31);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)out_value);
  return __return_storage_ptr__;
}

Assistant:

std::string ProxyConfig::getString(const char* key, const std::string& defaultValue)
{
	if (m_document.HasMember(key))
	{
		rapidjson::Value& out_value = m_document[key];
		if (out_value.IsString())
		{
			return out_value.GetString();
		}
	}
	return defaultValue;
}